

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

bool __thiscall bssl::DTLSMessageBitmap::Init(DTLSMessageBitmap *this,size_t num_bits)

{
  bool bVar1;
  ulong new_size;
  size_t bits_rounded;
  size_t num_bytes;
  size_t num_bits_local;
  DTLSMessageBitmap *this_local;
  
  if (num_bits + 7 < num_bits) {
    ERR_put_error(0x10,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x47);
    this_local._7_1_ = false;
  }
  else {
    new_size = num_bits + 7 >> 3;
    bVar1 = Array<unsigned_char>::Init(&this->bytes_,new_size);
    if (bVar1) {
      MarkRange(this,num_bits,new_size << 3);
      this->first_unmarked_byte_ = 0;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DTLSMessageBitmap::Init(size_t num_bits) {
  if (num_bits + 7 < num_bits) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }
  size_t num_bytes = (num_bits + 7) / 8;
  size_t bits_rounded = num_bytes * 8;
  if (!bytes_.Init(num_bytes)) {
    return false;
  }
  MarkRange(num_bits, bits_rounded);
  first_unmarked_byte_ = 0;
  return true;
}